

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpPrepass::BeginSection
          (BinaryReaderObjdumpPrepass *this,Index section_index,BinarySection section_code,
          Offset size)

{
  ObjdumpState *pOVar1;
  Index index;
  char *str;
  string_view local_40;
  Enum local_2c;
  Offset local_28;
  Offset size_local;
  BinarySection section_code_local;
  Index section_index_local;
  BinaryReaderObjdumpPrepass *this_local;
  
  local_28 = size;
  size_local._0_4_ = section_code;
  size_local._4_4_ = section_index;
  _section_code_local = this;
  local_2c = (Enum)anon_unknown_16::BinaryReaderObjdumpBase::BeginSection
                             (&this->super_BinaryReaderObjdumpBase,section_index,section_code,size);
  index = size_local._4_4_;
  if ((BinarySection)size_local != Custom) {
    pOVar1 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
    str = GetSectionName((BinarySection)size_local);
    string_view::string_view(&local_40,str);
    ObjdumpNames::Set(&pOVar1->section_names,index,local_40);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BeginSection(Index section_index,
                      BinarySection section_code,
                      Offset size) override {
    BinaryReaderObjdumpBase::BeginSection(section_index, section_code, size);
    if (section_code != BinarySection::Custom) {
      objdump_state_->section_names.Set(section_index,
                                        wabt::GetSectionName(section_code));
    }
    return Result::Ok;
  }